

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qguiapplication.cpp
# Opt level: O0

void __thiscall
QGuiApplicationPrivate::handlePaletteChanged(QGuiApplicationPrivate *this,char *className)

{
  QCoreApplication *pQVar1;
  QPalette *in_RSI;
  QGuiApplication *in_RDI;
  long in_FS_OFFSET;
  QEvent event;
  undefined1 *local_18;
  undefined1 *local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  if (in_RSI == (QPalette *)0x0) {
    QCoreApplication::instance();
    QGuiApplication::paletteChanged(in_RDI,in_RSI);
  }
  if ((((byte)QCoreApplicationPrivate::is_app_running & 1) != 0) &&
     (((byte)QCoreApplicationPrivate::is_app_closing & 1) == 0)) {
    local_18 = &DAT_aaaaaaaaaaaaaaaa;
    local_10 = &DAT_aaaaaaaaaaaaaaaa;
    QEvent::QEvent((QEvent *)&local_18,ApplicationPaletteChange);
    pQVar1 = QCoreApplication::instance();
    QCoreApplication::sendEvent((QObject *)pQVar1,(QEvent *)&local_18);
    QEvent::~QEvent((QEvent *)&local_18);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QGuiApplicationPrivate::handlePaletteChanged(const char *className)
{
#if QT_DEPRECATED_SINCE(6, 0)
    if (!className) {
        Q_ASSERT(app_pal);
QT_WARNING_PUSH
QT_WARNING_DISABLE_DEPRECATED
        emit qGuiApp->paletteChanged(*QGuiApplicationPrivate::app_pal);
QT_WARNING_POP
    }
#else
    Q_UNUSED(className);
#endif // QT_DEPRECATED_SINCE(6, 0)

    if (is_app_running && !is_app_closing) {
        QEvent event(QEvent::ApplicationPaletteChange);
        QGuiApplication::sendEvent(qGuiApp, &event);
    }
}